

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

void duckdb_brotli::InverseMoveToFrontTransform
               (uint8_t *v,uint64_t v_len,BrotliDecoderStateInternal *state)

{
  uint8_t *__src;
  uint8_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  int iVar11;
  undefined1 auVar10 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  
  uVar8 = state->mtf_upper_bound;
  state->mtf[1] = 0x3020100;
  auVar4 = _DAT_010d93c0;
  auVar3 = _DAT_00f8afd0;
  auVar2 = _DAT_00f8afc0;
  lVar5 = uVar8 + (uVar8 == 0);
  lVar6 = lVar5 + -1;
  auVar10._8_4_ = (int)lVar6;
  auVar10._0_8_ = lVar6;
  auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
  iVar12 = 0x3020100;
  iVar13 = 0x7060504;
  iVar14 = 0xb0a0908;
  iVar15 = 0xf0e0d0c;
  uVar7 = 0;
  auVar10 = auVar10 ^ _DAT_00f8afd0;
  do {
    auVar17._8_4_ = (int)uVar7;
    auVar17._0_8_ = uVar7;
    auVar17._12_4_ = (int)(uVar7 >> 0x20);
    auVar16 = (auVar17 | auVar2) ^ auVar3;
    iVar11 = auVar10._4_4_;
    if ((bool)(~(auVar16._4_4_ == iVar11 && auVar10._0_4_ < auVar16._0_4_ || iVar11 < auVar16._4_4_)
              & 1)) {
      state->mtf[uVar7 + 2] = iVar12 + 0x4040404;
    }
    if ((auVar16._12_4_ != auVar10._12_4_ || auVar16._8_4_ <= auVar10._8_4_) &&
        auVar16._12_4_ <= auVar10._12_4_) {
      state->mtf[uVar7 + 3] = iVar13 + 0x4040404;
    }
    auVar16 = (auVar17 | auVar4) ^ auVar3;
    iVar18 = auVar16._4_4_;
    if (iVar18 <= iVar11 && (iVar18 != iVar11 || auVar16._0_4_ <= auVar10._0_4_)) {
      state->mtf[uVar7 + 4] = iVar14 + 0x4040404;
      state->mtf[uVar7 + 5] = iVar15 + 0x4040404;
    }
    uVar7 = uVar7 + 4;
    iVar12 = iVar12 + 0x10101010;
    iVar13 = iVar13 + 0x10101010;
    iVar14 = iVar14 + 0x10101010;
    iVar15 = iVar15 + 0x10101010;
  } while ((lVar5 + 3U & 0xfffffffffffffffc) != uVar7);
  __src = (uint8_t *)((long)state->mtf + 3);
  uVar7 = 0;
  for (uVar8 = 0; v_len != uVar8; uVar8 = uVar8 + 1) {
    uVar9 = (ulong)v[uVar8];
    uVar1 = *(uint8_t *)((long)(state->mtf + 1) + uVar9);
    v[uVar8] = uVar1;
    *__src = uVar1;
    memmove(state->mtf + 1,__src,uVar9 + 1);
    uVar7 = uVar7 | uVar9;
  }
  state->mtf_upper_bound = uVar7 >> 2;
  return;
}

Assistant:

static BROTLI_NOINLINE void InverseMoveToFrontTransform(uint8_t *v, brotli_reg_t v_len, BrotliDecoderState *state) {
	/* Reinitialize elements that could have been changed. */
	brotli_reg_t i = 1;
	brotli_reg_t upper_bound = state->mtf_upper_bound;
	uint32_t *mtf = &state->mtf[1]; /* Make mtf[-1] addressable. */
	uint8_t *mtf_u8 = (uint8_t *)mtf;
	/* Load endian-aware constant. */
	const uint8_t b0123[4] = {0, 1, 2, 3};
	uint32_t pattern;
	memcpy(&pattern, &b0123, 4);

	/* Initialize list using 4 consequent values pattern. */
	mtf[0] = pattern;
	do {
		pattern += 0x04040404; /* Advance all 4 values by 4. */
		mtf[i] = pattern;
		i++;
	} while (i <= upper_bound);

	/* Transform the input. */
	upper_bound = 0;
	for (i = 0; i < v_len; ++i) {
		int index = v[i];
		uint8_t value = mtf_u8[index];
		upper_bound |= v[i];
		v[i] = value;
		mtf_u8[-1] = value;
		do {
			index--;
			mtf_u8[index + 1] = mtf_u8[index];
		} while (index >= 0);
	}
	/* Remember amount of elements to be reinitialized. */
	state->mtf_upper_bound = upper_bound >> 2;
}